

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O1

void __thiscall glslang::TLiveTraverser::pushGlobalReference(TLiveTraverser *this,TString *name)

{
  size_t *psVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  _List_node_base *p_Var6;
  long lVar7;
  long *plVar8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  _List_node_base *p_Var9;
  ulong uVar10;
  ulong uVar11;
  
  iVar4 = (*this->intermediate->treeRoot->_vptr_TIntermNode[6])();
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 400))
                    ((long *)CONCAT44(extraout_var,iVar4));
  lVar7 = *(long *)(lVar5 + 8);
  if (*(long *)(lVar5 + 0x10) != lVar7) {
    uVar10 = 0;
    uVar11 = 1;
    do {
      p_Var6 = (_List_node_base *)(**(code **)(**(long **)(lVar7 + uVar10 * 8) + 0x30))();
      if (((p_Var6 == (_List_node_base *)0x0) || (*(int *)&p_Var6[0xb]._M_prev != 1)) ||
         (lVar7 = (*(code *)p_Var6->_M_next[0x19]._M_next)(p_Var6),
         *(long *)(lVar7 + 0x10) - *(long *)(lVar7 + 8) != 8)) {
LAB_004826aa:
        bVar3 = false;
      }
      else {
        lVar7 = (*(code *)p_Var6->_M_next[0x19]._M_next)(p_Var6);
        lVar7 = (**(code **)(*(long *)**(undefined8 **)(lVar7 + 8) + 0x40))();
        if (lVar7 == 0) goto LAB_004826aa;
        lVar7 = (*(code *)p_Var6->_M_next[0x19]._M_next)(p_Var6);
        plVar8 = (long *)(**(code **)(*(long *)**(undefined8 **)(lVar7 + 8) + 0x40))();
        plVar8 = (long *)(**(code **)(*plVar8 + 400))(plVar8);
        plVar8 = (long *)(**(code **)(*plVar8 + 0x60))(plVar8);
        bVar3 = false;
        bVar2 = true;
        if ((plVar8 != (long *)0x0) &&
           (lVar7 = (**(code **)(*plVar8 + 0x108))(plVar8), (*(uint *)(lVar7 + 8) & 0x7f) == 1)) {
          this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*plVar8 + 400))(plVar8);
          iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(this_00,name);
          if (iVar4 == 0) {
            p_Var9 = (_List_node_base *)operator_new(0x18);
            p_Var9[1]._M_next = p_Var6;
            std::__detail::_List_node_base::_M_hook(p_Var9);
            psVar1 = &(this->destinations).
                      super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
            bVar3 = true;
            bVar2 = false;
          }
        }
        if (bVar2) goto LAB_004826aa;
      }
      if (bVar3) {
        return;
      }
      lVar7 = *(long *)(lVar5 + 8);
      bVar2 = uVar11 < (ulong)(*(long *)(lVar5 + 0x10) - lVar7 >> 3);
      uVar10 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void pushGlobalReference(const TString& name)
    {
        TIntermSequence& globals = intermediate.getTreeRoot()->getAsAggregate()->getSequence();
        for (unsigned int f = 0; f < globals.size(); ++f) {
            TIntermAggregate* candidate = globals[f]->getAsAggregate();
            if (candidate && candidate->getOp() == EOpSequence &&
                candidate->getSequence().size() == 1 &&
                candidate->getSequence()[0]->getAsBinaryNode()) {
                TIntermBinary* binary = candidate->getSequence()[0]->getAsBinaryNode();
                TIntermSymbol* symbol = binary->getLeft()->getAsSymbolNode();
                if (symbol && symbol->getQualifier().storage == EvqGlobal &&
                    symbol->getName() == name) {
                    destinations.push_back(candidate);
                    break;
                }
            }
        }
    }